

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O1

void __thiscall
vkt::
InstanceFactory1<vkt::wsi::(anonymous_namespace)::DisplayTimingTestInstance,_vkt::wsi::(anonymous_namespace)::TestConfig,_vkt::wsi::(anonymous_namespace)::Programs>
::initPrograms(InstanceFactory1<vkt::wsi::(anonymous_namespace)::DisplayTimingTestInstance,_vkt::wsi::(anonymous_namespace)::TestConfig,_vkt::wsi::(anonymous_namespace)::Programs>
               *this,SourceCollections *dst)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  ProgramSources *pPVar4;
  long *plVar5;
  size_type __dnew;
  long *local_a0;
  long local_98;
  long local_90 [2];
  long local_80;
  string local_78;
  uint local_58;
  value_type local_50;
  
  paVar1 = &local_78.field_2;
  local_78.field_2._M_allocated_capacity = 0x7265762d64617571;
  local_78.field_2._8_2_ = 0x74;
  local_78._M_string_length = 9;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_78);
  local_80 = 0xef;
  local_a0 = local_90;
  plVar5 = (long *)std::__cxx11::string::_M_create((ulong *)&local_a0,(ulong)&local_80);
  lVar3 = local_80;
  local_90[0] = local_80;
  local_a0 = plVar5;
  memcpy(plVar5,
         "#version 450\nout gl_PerVertex {\n\tvec4 gl_Position;\n};\nhighp float;\nvoid main (void) {\n\tgl_Position = vec4(((gl_VertexIndex + 2) / 3) % 2 == 0 ? -1.0 : 1.0,\n\t                   ((gl_VertexIndex + 1) / 3) % 2 == 0 ? -1.0 : 1.0, 0.0, 1.0);\n}\n"
         ,0xef);
  local_98 = lVar3;
  *(undefined1 *)((long)plVar5 + lVar3) = 0;
  local_58 = 0;
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_a0,lVar3 + (long)local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar4->sources + local_58,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78.field_2._M_allocated_capacity = 0x6172662d64617571;
  local_78.field_2._8_2_ = 0x67;
  local_78._M_string_length = 9;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_78);
  local_80 = 0x336;
  local_a0 = local_90;
  plVar5 = (long *)std::__cxx11::string::_M_create((ulong *)&local_a0,(ulong)&local_80);
  lVar3 = local_80;
  local_90[0] = local_80;
  local_a0 = plVar5;
  memcpy(plVar5,
         "#version 310 es\nlayout(location = 0) out highp vec4 o_color;\nlayout(push_constant) uniform PushConstant {\n\thighp uint frameNdx;\n} pushConstants;\nvoid main (void)\n{\n\thighp uint frameNdx = pushConstants.frameNdx;\n\thighp uint x = frameNdx + uint(gl_FragCoord.x);\n\thighp uint y = frameNdx + uint(gl_FragCoord.y);\n\thighp uint r = 128u * bitfieldExtract(x, 0, 1)\n\t             +  64u * bitfieldExtract(y, 1, 1)\n\t             +  32u * bitfieldExtract(x, 3, 1);\n\thighp uint g = 128u * bitfieldExtract(y, 0, 1)\n\t             +  64u * bitfieldExtract(x, 2, 1)\n\t             +  32u * bitfieldExtract(y, 3, 1);\n\thighp uint b = 128u * bitfieldExtract(x, 1, 1)\n\t             +  64u * bitfieldExtract(y, 2, 1)\n\t             +  32u * bitfieldExtract(x, 4, 1);\n\to_color = vec4(float(r) / 255.0, float(g) / 255.0, float(b) / 255.0, 1.0);\n}\n"
         ,0x336);
  local_98 = lVar3;
  *(undefined1 *)((long)plVar5 + lVar3) = 0;
  local_58 = 1;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_a0,lVar3 + (long)local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar4->sources + local_58,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void			initPrograms		(vk::SourceCollections& dst) const { m_progs.init(dst, m_arg0); }